

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

Variable * __thiscall soul::ModuleCloner::cloneVariable(ModuleCloner *this,Variable *old)

{
  unordered_map<soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>,_std::hash<soul::pool_ref<const_soul::heart::Variable>_>,_std::equal_to<soul::pool_ref<const_soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>_>
  *this_00;
  Module *this_01;
  bool bVar1;
  mapped_type *this_02;
  CodeLocation *args;
  Variable *pVVar2;
  Expression *pEVar3;
  pool_ptr<soul::heart::Variable> local_70;
  pool_ptr<soul::heart::Expression> local_68;
  Identifier local_60;
  Type local_58;
  Variable *local_40;
  Variable *v;
  pool_ref<const_soul::heart::Variable> local_28;
  mapped_type *local_20;
  mapped_type *mapping;
  Variable *old_local;
  ModuleCloner *this_local;
  
  this_00 = this->variableMappings;
  mapping = (mapped_type *)old;
  old_local = (Variable *)this;
  pool_ref<soul::heart::Variable_const>::pool_ref<soul::heart::Variable_const,void>
            ((pool_ref<soul::heart::Variable_const> *)&local_28,old);
  this_02 = std::
            unordered_map<soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>,_std::hash<soul::pool_ref<const_soul::heart::Variable>_>,_std::equal_to<soul::pool_ref<const_soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>_>
            ::operator[](this_00,(key_type *)&local_28);
  pool_ref<const_soul::heart::Variable>::~pool_ref(&local_28);
  local_20 = this_02;
  bVar1 = pool_ptr<soul::heart::Variable>::operator==(this_02,(void *)0x0);
  checkAssertion(bVar1,"mapping == nullptr","cloneVariable",0xf4);
  this_01 = this->newModule;
  args = (CodeLocation *)(mapping + 1);
  cloneType(&local_58,this,(Type *)(mapping + 3));
  local_60 = heart::Allocator::get<soul::Identifier>
                       (this->newModule->allocator,(Identifier *)(mapping + 6));
  pVVar2 = Module::
           allocate<soul::heart::Variable,soul::CodeLocation_const&,soul::Type,soul::Identifier,soul::heart::Variable::Role_const&>
                     (this_01,args,&local_58,&local_60,(Role *)(mapping + 7));
  Type::~Type(&local_58);
  pVVar2->externalHandle = (Handle)mapping[0xe].object;
  local_40 = pVVar2;
  bVar1 = pool_ptr<soul::heart::Expression>::operator!=
                    ((pool_ptr<soul::heart::Expression> *)(mapping + 0xf),(void *)0x0);
  if (bVar1) {
    pEVar3 = pool_ptr<soul::heart::Expression>::operator*
                       ((pool_ptr<soul::heart::Expression> *)(mapping + 0xf));
    pEVar3 = cloneExpression(this,pEVar3);
    pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::Expression,void>(&local_68,pEVar3);
    (local_40->initialValue).object = local_68.object;
    pool_ptr<soul::heart::Expression>::~pool_ptr(&local_68);
  }
  Annotation::operator=(&local_40->annotation,(Annotation *)(mapping + 8));
  pool_ptr<soul::heart::Variable>::pool_ptr<soul::heart::Variable,void>(&local_70,local_40);
  local_20->object = local_70.object;
  pool_ptr<soul::heart::Variable>::~pool_ptr(&local_70);
  return local_40;
}

Assistant:

heart::Variable& cloneVariable (const heart::Variable& old)
    {
        auto& mapping = variableMappings[old];
        SOUL_ASSERT (mapping == nullptr);
        auto& v = newModule.allocate<heart::Variable> (old.location, cloneType (old.type),
                                                       newModule.allocator.get (old.name),
                                                       old.role);
        v.externalHandle = old.externalHandle;

        if (old.initialValue != nullptr)
            v.initialValue = cloneExpression (*old.initialValue);

        v.annotation = old.annotation;
        mapping = v;
        return v;
    }